

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Export,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  Export *pEVar1;
  ExceptionGuard *this_local;
  
  while (this->start < this->pos) {
    pEVar1 = this->pos;
    this->pos = pEVar1 + -1;
    dtor<capnp::_::RpcSystemBase::RpcConnectionState::Export>(pEVar1 + -1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }